

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fxch.c
# Opt level: O3

int Fxch_FastExtract(Vec_Wec_t *vCubes,int ObjIdMax,int nMaxDivExt,int fVerbose,int fVeryVerbose)

{
  undefined4 *puVar1;
  undefined8 *puVar2;
  int iDiv;
  int iVar3;
  Vec_Que_t *pVVar4;
  int *piVar5;
  float *pfVar6;
  int *piVar7;
  Vec_Int_t *pVVar8;
  void *__ptr;
  undefined4 uVar9;
  undefined4 uVar10;
  int iVar11;
  Fxch_Man_t *pFxchMan;
  long lVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  Fxch_Man_t *pFVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  bool bVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  timespec ts;
  timespec local_50;
  int local_40;
  int local_3c;
  long local_38;
  
  local_3c = nMaxDivExt;
  pFxchMan = Fxch_ManAlloc(vCubes);
  iVar11 = clock_gettime(3,&local_50);
  if (iVar11 < 0) {
    lVar14 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  Fxch_CubesGruping(pFxchMan);
  Fxch_ManMapLiteralsIntoCubes(pFxchMan,ObjIdMax);
  Fxch_ManGenerateLitHashKeys(pFxchMan);
  Fxch_ManComputeLevel(pFxchMan);
  Fxch_ManSCHashTablesInit(pFxchMan);
  Fxch_ManDivCreate(pFxchMan);
  iVar11 = clock_gettime(3,&local_50);
  if (iVar11 < 0) {
    lVar15 = -1;
  }
  else {
    lVar15 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  pFxchMan->timeInit = lVar15 + lVar14;
  if (fVeryVerbose != 0) {
    Fxch_ManPrintDivs(pFxchMan);
  }
  if (fVerbose != 0) {
    Fxch_ManPrintStats(pFxchMan);
  }
  iVar11 = clock_gettime(3,&local_50);
  if (iVar11 < 0) {
    local_38 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    local_38 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  local_40 = fVerbose;
  if (-1 < local_3c) {
    iVar11 = 0;
    do {
      pVVar4 = pFxchMan->vDivPrio;
      if (pVVar4->nSize < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecQue.h"
                      ,0x88,"int Vec_QueSize(Vec_Que_t *)");
      }
      if (pVVar4->nSize == 1) break;
      piVar5 = pVVar4->pHeap;
      iDiv = piVar5[1];
      pfVar6 = *pVVar4->pCostsFlt;
      if (pfVar6 == (float *)0x0) {
        fVar22 = (float)iDiv;
      }
      else {
        fVar22 = pfVar6[iDiv];
      }
      if (fVar22 <= 0.0) break;
      piVar7 = pVVar4->pOrder;
      piVar7[iDiv] = -1;
      iVar18 = pVVar4->nSize;
      pVVar4->nSize = iVar18 + -1;
      if (iVar18 + -1 == 1) {
        piVar5[1] = -1;
      }
      else {
        iVar3 = piVar5[(long)iVar18 + -1];
        piVar5[(long)iVar18 + -1] = -1;
        piVar5[1] = iVar3;
        piVar7[iVar3] = 1;
        if (pfVar6 == (float *)0x0) {
          fVar22 = (float)iVar3;
        }
        else {
          fVar22 = pfVar6[iVar3];
        }
        iVar18 = pVVar4->nSize;
        uVar16 = 1;
        if (2 < iVar18) {
          uVar13 = 2;
          uVar16 = 1;
          do {
            uVar20 = uVar13 | 1;
            uVar19 = uVar13;
            if ((int)uVar20 < iVar18) {
              if (pfVar6 == (float *)0x0) {
                fVar23 = (float)piVar5[(int)uVar13];
                fVar24 = (float)piVar5[(int)uVar20];
              }
              else {
                fVar23 = pfVar6[piVar5[(int)uVar13]];
                fVar24 = pfVar6[piVar5[(int)uVar20]];
              }
              if (fVar23 < fVar24) {
                uVar19 = uVar20;
              }
            }
            if (iVar18 <= (int)uVar19) {
              __assert_fail("child < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecQue.h"
                            ,0xbc,"void Vec_QueMoveDown(Vec_Que_t *, int)");
            }
            iVar18 = piVar5[(int)uVar19];
            if (pfVar6 == (float *)0x0) {
              fVar23 = (float)iVar18;
            }
            else {
              fVar23 = pfVar6[iVar18];
            }
            if (fVar23 <= fVar22) break;
            piVar5[(int)uVar16] = iVar18;
            piVar7[iVar18] = uVar16;
            uVar13 = uVar19 * 2;
            iVar18 = pVVar4->nSize;
            uVar16 = uVar19;
          } while ((int)uVar13 < iVar18);
        }
        piVar5[(int)uVar16] = iVar3;
        piVar7[iVar3] = uVar16;
      }
      if (fVeryVerbose != 0) {
        Fxch_DivPrint(pFxchMan,iDiv);
      }
      iVar18 = local_3c;
      bVar21 = local_3c == 0;
      Fxch_ManUpdate(pFxchMan,iDiv);
      iVar11 = iVar11 + 1;
    } while (iVar11 < iVar18 || bVar21);
  }
  iVar11 = clock_gettime(3,&local_50);
  if (iVar11 < 0) {
    lVar14 = -1;
  }
  else {
    lVar14 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  pFxchMan->timeExt = lVar14 + local_38;
  if (local_40 != 0) {
    pFVar17 = pFxchMan;
    Fxch_ManPrintStats(pFxchMan);
    lVar14 = pFxchMan->timeExt;
    lVar15 = pFxchMan->timeInit;
    iVar11 = (int)pFVar17;
    Abc_Print(iVar11,"%s =","\n[FXCH] Elapsed Time");
    Abc_Print(iVar11,"%9.2f sec\n",SUB84((double)(lVar14 + lVar15) / 1000000.0,0));
    lVar14 = pFxchMan->timeInit;
    Abc_Print(iVar11,"%s =","[FXCH]    +-> Init");
    Abc_Print(iVar11,"%9.2f sec\n",SUB84((double)lVar14 / 1000000.0,0));
    lVar14 = pFxchMan->timeExt;
    Abc_Print(iVar11,"%s =","[FXCH]    +-> Extr");
    Abc_Print(iVar11,"%9.2f sec\n",SUB84((double)lVar14 / 1000000.0,0));
  }
  Fxch_CubesUnGruping(pFxchMan);
  Fxch_ManSCHashTablesFree(pFxchMan);
  Fxch_ManFree(pFxchMan);
  iVar11 = vCubes->nSize;
  if (iVar11 < 1) {
    uVar16 = 0;
  }
  else {
    lVar14 = 0;
    lVar15 = 8;
    uVar16 = 0;
    do {
      pVVar8 = vCubes->pArray;
      if (*(int *)((long)pVVar8 + lVar15 + -4) < 1) {
        __ptr = *(void **)((long)&pVVar8->nCap + lVar15);
        if (__ptr != (void *)0x0) {
          free(__ptr);
          *(undefined8 *)((long)&pVVar8->nCap + lVar15) = 0;
        }
      }
      else {
        puVar1 = (undefined4 *)((long)&pVVar8->nCap + lVar15);
        lVar12 = (long)(int)uVar16;
        uVar16 = uVar16 + 1;
        iVar11 = puVar1[-1];
        uVar9 = *puVar1;
        uVar10 = puVar1[1];
        pVVar8 = pVVar8 + lVar12;
        pVVar8->nCap = puVar1[-2];
        pVVar8->nSize = iVar11;
        *(undefined4 *)&pVVar8->pArray = uVar9;
        *(undefined4 *)((long)&pVVar8->pArray + 4) = uVar10;
      }
      lVar14 = lVar14 + 1;
      iVar11 = vCubes->nSize;
      lVar15 = lVar15 + 0x10;
    } while (lVar14 < iVar11);
    if ((int)uVar16 < iVar11) {
      if ((int)uVar16 < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      lVar14 = (ulong)uVar16 << 4;
      uVar13 = uVar16;
      do {
        puVar2 = (undefined8 *)((long)&vCubes->pArray->nCap + lVar14);
        *puVar2 = 0;
        puVar2[1] = 0;
        iVar11 = vCubes->nSize;
        uVar13 = uVar13 + 1;
        lVar14 = lVar14 + 0x10;
      } while ((int)uVar13 < iVar11);
    }
  }
  if (iVar11 < (int)uVar16) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                  ,0xfa,"void Vec_WecShrink(Vec_Wec_t *, int)");
  }
  vCubes->nSize = uVar16;
  qsort(vCubes->pArray,(long)(int)uVar16,0x10,Vec_WecSortCompare3);
  return 1;
}

Assistant:

int Fxch_FastExtract( Vec_Wec_t* vCubes,
                      int ObjIdMax,
                      int nMaxDivExt,
                      int fVerbose,
                      int fVeryVerbose )
{
    abctime TempTime;
    Fxch_Man_t* pFxchMan = Fxch_ManAlloc( vCubes );
    int i;

    TempTime = Abc_Clock();
    Fxch_CubesGruping( pFxchMan );
    Fxch_ManMapLiteralsIntoCubes( pFxchMan, ObjIdMax );
    Fxch_ManGenerateLitHashKeys( pFxchMan );
    Fxch_ManComputeLevel( pFxchMan );
    Fxch_ManSCHashTablesInit( pFxchMan );
    Fxch_ManDivCreate( pFxchMan );
    pFxchMan->timeInit = Abc_Clock() - TempTime;

    if ( fVeryVerbose )
        Fxch_ManPrintDivs( pFxchMan );

    if ( fVerbose )
        Fxch_ManPrintStats( pFxchMan );

    TempTime = Abc_Clock();
    
    for ( i = 0; (!nMaxDivExt || i < nMaxDivExt) && Vec_QueTopPriority( pFxchMan->vDivPrio ) > 0.0; i++ )
    {
        int iDiv = Vec_QuePop( pFxchMan->vDivPrio );

        if ( fVeryVerbose )
            Fxch_DivPrint( pFxchMan, iDiv );

        Fxch_ManUpdate( pFxchMan, iDiv );
    }
   
    pFxchMan->timeExt = Abc_Clock() - TempTime;

    if ( fVerbose )
    {
        Fxch_ManPrintStats( pFxchMan );
        Abc_PrintTime( 1, "\n[FXCH] Elapsed Time", pFxchMan->timeInit + pFxchMan->timeExt );
        Abc_PrintTime( 1, "[FXCH]    +-> Init", pFxchMan->timeInit );
        Abc_PrintTime( 1, "[FXCH]    +-> Extr", pFxchMan->timeExt );
    }

    Fxch_CubesUnGruping( pFxchMan );
    Fxch_ManSCHashTablesFree( pFxchMan );
    Fxch_ManFree( pFxchMan );

    Vec_WecRemoveEmpty( vCubes );
    Vec_WecSortByFirstInt( vCubes, 0 );

    return 1;
}